

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode.c
# Opt level: O3

Data processArray(fy_node *node)

{
  Array a;
  fy_node *node_00;
  Data pvVar1;
  void *iter;
  void *local_20;
  
  a = newArray();
  local_20 = (void *)0x0;
  node_00 = fy_node_sequence_iterate(node,&local_20);
  if (node_00 != (fy_node *)0x0) {
    do {
      pvVar1 = parseYaml(node_00);
      if (pvVar1 == (Data)0x0) {
        freeArray(a);
        return (Data)0x0;
      }
      putArray(a,pvVar1);
      node_00 = fy_node_sequence_iterate(node,&local_20);
    } while (node_00 != (fy_node *)0x0);
  }
  pvVar1 = newDataArray(a);
  return pvVar1;
}

Assistant:

Data processArray(struct fy_node *node) {
    Array a = newArray();
    //struct fy_node *fy_node_sequence_iterate(struct fy_node *fyn, void **prevp)
    struct fy_node *seqNode;
    void *iter = NULL;
    while ((seqNode = fy_node_sequence_iterate(node, &iter))) {
        Data to_append = parseYaml(seqNode);
        if (to_append == NULL) {
            freeArray(a);
            return NULL;
        }
        putArray(a, to_append);
    }
    return newDataArray(a);
}